

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superscalar.cpp
# Opt level: O2

void __thiscall
defyx::SuperscalarInstructionInfo::SuperscalarInstructionInfo
          (SuperscalarInstructionInfo *this,char *name,SuperscalarInstructionType type,MacroOp *op,
          int srcOp)

{
  undefined8 uVar1;
  MacroOp MStack_38;
  
  this->name_ = name;
  this->type_ = type;
  (this->ops_).super__Vector_base<defyx::MacroOp,_std::allocator<defyx::MacroOp>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ops_).super__Vector_base<defyx::MacroOp,_std::allocator<defyx::MacroOp>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->ops_).super__Vector_base<defyx::MacroOp,_std::allocator<defyx::MacroOp>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->latency_ = op->latency_;
  this->resultOp_ = 0;
  this->dstOp_ = 0;
  this->srcOp_ = srcOp;
  MStack_38.name_ = op->name_;
  uVar1._0_4_ = op->size_;
  uVar1._4_4_ = op->latency_;
  MStack_38._17_8_ = *(undefined8 *)((long)&op->uop1_ + 1);
  MStack_38.uop1_._0_1_ = (undefined1)((ulong)*(undefined8 *)((long)&op->size_ + 1) >> 0x38);
  MStack_38.size_._0_1_ = (undefined1)(undefined4)uVar1;
  MStack_38._9_7_ = SUB87((ulong)uVar1 >> 8,0);
  std::vector<defyx::MacroOp,_std::allocator<defyx::MacroOp>_>::emplace_back<defyx::MacroOp>
            (&this->ops_,&MStack_38);
  return;
}

Assistant:

SuperscalarInstructionInfo(const char* name, SuperscalarInstructionType type, const MacroOp& op, int srcOp)
			: name_(name), type_(type), latency_(op.getLatency()), srcOp_(srcOp) {
			ops_.push_back(MacroOp(op));
		}